

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

void uv__async_stop(uv_loop_t *loop)

{
  int fd;
  uv__queue *puVar1;
  uv__queue queue;
  
  if ((loop->async_io_watcher).fd != -1) {
    uv__queue_move(&loop->async_handles,&queue);
    while (queue.next != &queue) {
      puVar1 = (queue.next)->next;
      (queue.next)->prev->next = puVar1;
      puVar1->prev = (queue.next)->prev;
      (queue.next)->next = &loop->async_handles;
      puVar1 = (loop->async_handles).prev;
      (queue.next)->prev = puVar1;
      puVar1->next = queue.next;
      (loop->async_handles).prev = queue.next;
      uv__async_spin((uv_async_t *)&queue.next[-5].prev);
    }
    fd = loop->async_wfd;
    if (fd != -1) {
      if (fd != (loop->async_io_watcher).fd) {
        uv__close(fd);
      }
      loop->async_wfd = -1;
    }
    uv__io_stop(loop,&loop->async_io_watcher,1);
    uv__close((loop->async_io_watcher).fd);
    (loop->async_io_watcher).fd = -1;
  }
  return;
}

Assistant:

void uv__async_stop(uv_loop_t* loop) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;

  if (loop->async_io_watcher.fd == -1)
    return;

  /* Make sure no other thread is accessing the async handle fd after the loop
   * cleanup.
   */
  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    uv__async_spin(h);
  }

  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;
}